

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sglrReferenceContext.cpp
# Opt level: O3

void __thiscall
sglr::ReferenceContext::uniformMatrix4fv
          (ReferenceContext *this,deInt32 location,deInt32 count,deBool transpose,float *value)

{
  ShaderProgram *pSVar1;
  pointer pUVar2;
  long lVar3;
  long lVar4;
  ulong uVar5;
  long lVar6;
  long lVar7;
  ulong uVar8;
  
  if (this->m_currentProgram != (ShaderProgramObjectContainer *)0x0) {
    if (location == -1) {
      return;
    }
    if (-1 < location) {
      pSVar1 = this->m_currentProgram->m_program;
      uVar5 = (ulong)(uint)location;
      pUVar2 = (pSVar1->m_uniforms).
               super__Vector_base<sglr::UniformSlot,_std::allocator<sglr::UniformSlot>_>._M_impl.
               super__Vector_impl_data._M_start;
      uVar8 = ((long)(pSVar1->m_uniforms).
                     super__Vector_base<sglr::UniformSlot,_std::allocator<sglr::UniformSlot>_>.
                     _M_impl.super__Vector_impl_data._M_finish - (long)pUVar2 >> 4) *
              0x6db6db6db6db6db7;
      if (uVar5 <= uVar8 && uVar8 - uVar5 != 0) {
        if (count == 0) {
          return;
        }
        if (1 < (uint)transpose) {
          if (this->m_lastError != 0) {
            return;
          }
          this->m_lastError = 0x500;
          return;
        }
        lVar6 = uVar5 * 0x70;
        if ((pUVar2[uVar5].type == TYPE_FLOAT_MAT4) && (count < 2)) {
          if (transpose != 0) {
            lVar6 = lVar6 + 0x24;
            lVar3 = 0;
            do {
              lVar4 = 0;
              do {
                *(float *)((long)&(((pSVar1->m_uniforms).
                                    super__Vector_base<sglr::UniformSlot,_std::allocator<sglr::UniformSlot>_>
                                    ._M_impl.super__Vector_impl_data._M_start)->name)._M_dataplus.
                                  _M_p + lVar4 * 4 + lVar6) = value[lVar4];
                lVar4 = lVar4 + 1;
              } while (lVar4 != 4);
              lVar3 = lVar3 + 1;
              lVar6 = lVar6 + 0xc;
              value = value + 3;
            } while (lVar3 != 4);
            return;
          }
          lVar3 = 0;
          do {
            lVar7 = 0;
            lVar4 = lVar6;
            do {
              *(float *)((long)&((pSVar1->m_uniforms).
                                 super__Vector_base<sglr::UniformSlot,_std::allocator<sglr::UniformSlot>_>
                                 ._M_impl.super__Vector_impl_data._M_start)->value + lVar4) =
                   value[lVar7];
              lVar7 = lVar7 + 3;
              lVar4 = lVar4 + 4;
            } while (lVar7 != 0xc);
            lVar3 = lVar3 + 1;
            value = value + 1;
            lVar6 = lVar6 + 0xc;
          } while (lVar3 != 4);
          return;
        }
      }
    }
  }
  if (this->m_lastError != 0) {
    return;
  }
  this->m_lastError = 0x502;
  return;
}

Assistant:

void ReferenceContext::uniformMatrix4fv (deInt32 location, deInt32 count, deBool transpose, const float *value)
{
	RC_IF_ERROR(m_currentProgram == DE_NULL, GL_INVALID_OPERATION, RC_RET_VOID);

	std::vector<sglr::UniformSlot>& uniforms = m_currentProgram->m_program->m_uniforms;

	if (location == -1)
		return;

	RC_IF_ERROR(location < 0 || (size_t)location >= uniforms.size(), GL_INVALID_OPERATION, RC_RET_VOID);

	if (count == 0)
		return;

	RC_IF_ERROR(transpose != GL_TRUE && transpose != GL_FALSE, GL_INVALID_ENUM, RC_RET_VOID);

	switch (uniforms[location].type)
	{
		case glu::TYPE_FLOAT_MAT4:
			RC_IF_ERROR(count > 1, GL_INVALID_OPERATION, RC_RET_VOID);

			if (transpose == GL_FALSE) // input is column major => transpose from column major to internal row major
				for (int row = 0; row < 4; ++row)
				for (int col = 0; col < 4; ++col)
					uniforms[location].value.m4[row*3+col] = value[col*3+row];
			else // input is row major
				for (int row = 0; row < 4; ++row)
				for (int col = 0; col < 4; ++col)
					uniforms[location].value.m4[row*3+col] = value[row*3+col];

			break;

		default:
			setError(GL_INVALID_OPERATION);
			return;
	}
}